

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-font.c
# Opt level: O0

pdf_font_desc * pdf_load_font(hd_context *ctx,pdf_document *doc,pdf_obj *dict)

{
  hd_document_count_pages_fn *phVar1;
  int *piVar2;
  int iVar3;
  hd_context *local_48;
  pdf_font_desc *fontdesc;
  pdf_obj *charprocs;
  pdf_obj *dfonts;
  pdf_obj *subtype;
  pdf_obj *dict_local;
  pdf_document *doc_local;
  hd_context *ctx_local;
  
  local_48 = (hd_context *)0x0;
  subtype = dict;
  dict_local = (pdf_obj *)doc;
  doc_local = (pdf_document *)ctx;
  local_48 = (hd_context *)pdf_find_item(ctx,pdf_drop_font_imp,dict);
  ctx_local = local_48;
  if (local_48 == (hd_context *)0x0) {
    dfonts = pdf_dict_get((hd_context *)doc_local,subtype,(pdf_obj *)0x149);
    charprocs = pdf_dict_get((hd_context *)doc_local,subtype,(pdf_obj *)0x69);
    fontdesc = (pdf_font_desc *)pdf_dict_get((hd_context *)doc_local,subtype,(pdf_obj *)0x48);
    hd_var_imp(&local_48);
    iVar3 = hd_push_try((hd_context *)doc_local);
    if ((iVar3 != 0) &&
       (iVar3 = __sigsetjmp(*(long *)(doc_local->super).count_pages + 8,0), iVar3 == 0)) {
      iVar3 = pdf_name_eq((hd_context *)doc_local,dfonts,(pdf_obj *)0x15a);
      if (iVar3 == 0) {
        iVar3 = pdf_name_eq((hd_context *)doc_local,dfonts,(pdf_obj *)0x15b);
        if (iVar3 == 0) {
          iVar3 = pdf_name_eq((hd_context *)doc_local,dfonts,(pdf_obj *)0xe7);
          if (iVar3 == 0) {
            iVar3 = pdf_name_eq((hd_context *)doc_local,dfonts,(pdf_obj *)0x157);
            if (iVar3 == 0) {
              iVar3 = pdf_name_eq((hd_context *)doc_local,dfonts,(pdf_obj *)0x15d);
              if (iVar3 == 0) {
                if (fontdesc == (pdf_font_desc *)0x0) {
                  if (charprocs == (pdf_obj *)0x0) {
                    hd_warn((hd_context *)doc_local,
                            "unknown font format, guessing type1 or truetype.");
                    local_48 = (hd_context *)
                               pdf_load_simple_font
                                         ((hd_context *)doc_local,(pdf_document *)dict_local,subtype
                                         );
                  }
                  else {
                    hd_warn((hd_context *)doc_local,"unknown font format, guessing type0.");
                    local_48 = (hd_context *)
                               pdf_load_type0_font((hd_context *)doc_local,
                                                   (pdf_document *)dict_local,subtype);
                  }
                }
                else {
                  hd_warn((hd_context *)doc_local,"unknown font format, guessing type3.");
                  local_48 = (hd_context *)0x0;
                }
              }
              else {
                local_48 = (hd_context *)0x0;
              }
            }
            else {
              local_48 = (hd_context *)
                         pdf_load_simple_font
                                   ((hd_context *)doc_local,(pdf_document *)dict_local,subtype);
            }
          }
          else {
            local_48 = (hd_context *)
                       pdf_load_simple_font
                                 ((hd_context *)doc_local,(pdf_document *)dict_local,subtype);
          }
        }
        else {
          local_48 = (hd_context *)
                     pdf_load_simple_font
                               ((hd_context *)doc_local,(pdf_document *)dict_local,subtype);
        }
      }
      else {
        local_48 = (hd_context *)
                   pdf_load_type0_font((hd_context *)doc_local,(pdf_document *)dict_local,subtype);
      }
    }
    phVar1 = (doc_local->super).count_pages;
    piVar2 = *(int **)phVar1;
    *(int **)phVar1 = piVar2 + -0x34;
    if (1 < *piVar2) {
      pdf_drop_font((hd_context *)doc_local,(pdf_font_desc *)local_48);
      hd_rethrow((hd_context *)doc_local);
    }
    if (local_48 != (hd_context *)0x0) {
      pdf_store_item((hd_context *)doc_local,subtype,local_48,(size_t)local_48->error);
    }
    ctx_local = local_48;
  }
  return (pdf_font_desc *)ctx_local;
}

Assistant:

pdf_font_desc *
pdf_load_font(hd_context *ctx, pdf_document *doc, pdf_obj *dict)
{
    pdf_obj *subtype;
    pdf_obj *dfonts;
    pdf_obj *charprocs;
    pdf_font_desc *fontdesc = NULL;

    if ((fontdesc = pdf_find_item(ctx, pdf_drop_font_imp, dict)) != NULL)
    {
        return fontdesc;
    }

    subtype = pdf_dict_get(ctx, dict, PDF_NAME_Subtype);
    dfonts = pdf_dict_get(ctx, dict, PDF_NAME_DescendantFonts);
    charprocs = pdf_dict_get(ctx, dict, PDF_NAME_CharProcs);

    hd_var(fontdesc);

    hd_try(ctx)
    {
        //TODO:pdf_load_type3_font;
        if (pdf_name_eq(ctx, subtype, PDF_NAME_Type0))
            fontdesc = pdf_load_type0_font(ctx, doc, dict);
        else if (pdf_name_eq(ctx, subtype, PDF_NAME_Type1))
            fontdesc = pdf_load_simple_font(ctx, doc, dict);
        else if (pdf_name_eq(ctx, subtype, PDF_NAME_MMType1))
            fontdesc = pdf_load_simple_font(ctx, doc, dict);
        else if (pdf_name_eq(ctx, subtype, PDF_NAME_TrueType))
            fontdesc = pdf_load_simple_font(ctx, doc, dict);
        else if (pdf_name_eq(ctx, subtype, PDF_NAME_Type3))
        {
            fontdesc = NULL;
        }
        else if (charprocs)
        {
            hd_warn(ctx, "unknown font format, guessing type3.");
            fontdesc = NULL;
        }
        else if (dfonts)
        {
            hd_warn(ctx, "unknown font format, guessing type0.");
            fontdesc = pdf_load_type0_font(ctx, doc, dict);
        }
        else
        {
            hd_warn(ctx, "unknown font format, guessing type1 or truetype.");
            fontdesc = pdf_load_simple_font(ctx, doc, dict);
        }

    }
    hd_catch(ctx)
    {
        pdf_drop_font(ctx, fontdesc);
        hd_rethrow(ctx);
    }

    if (fontdesc != NULL)
        pdf_store_item(ctx, dict, fontdesc, fontdesc->size);

    return fontdesc;
}